

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

size_t tcg_code_capacity_mips(TCGContext_conflict3 *tcg_ctx)

{
  long lVar1;
  size_t capacity;
  size_t guard_size;
  TCGContext_conflict3 *tcg_ctx_local;
  
  lVar1 = (tcg_ctx->region).stride - (tcg_ctx->region).size;
  return (long)(tcg_ctx->region).end +
         ((lVar1 - (long)(tcg_ctx->region).start) - (tcg_ctx->region).n * (lVar1 + 0x400));
}

Assistant:

size_t tcg_code_capacity(TCGContext *tcg_ctx)
{
    size_t guard_size, capacity;

    /* no need for synchronization; these variables are set at init time */
    guard_size = tcg_ctx->region.stride - tcg_ctx->region.size;
    capacity = (char *)tcg_ctx->region.end + guard_size - (char *)tcg_ctx->region.start;
    capacity -= tcg_ctx->region.n * (guard_size + TCG_HIGHWATER);
    return capacity;
}